

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.h
# Opt level: O0

void __thiscall libDAI::RegionGraph::RegionGraph(RegionGraph *this,FactorGraph *fg)

{
  FactorGraph *in_RSI;
  BipartiteGraph<libDAI::FRegion,_libDAI::Region> *in_RDI;
  FactorGraph *in_stack_ffffffffffffffe8;
  
  GraphicalModel::GraphicalModel((GraphicalModel *)in_RDI);
  (in_RDI->_V1).super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__RegionGraph_00d4d9e8;
  FactorGraph::FactorGraph(in_RSI,in_stack_ffffffffffffffe8);
  BipartiteGraph<libDAI::FRegion,_libDAI::Region>::BipartiteGraph(in_RDI);
  memset(&in_RDI[2]._E12ind.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish,0,0x30);
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *)0xb59b1d);
  return;
}

Assistant:

RegionGraph(const FactorGraph & fg) : GraphicalModel(), _fg(fg), _rg(), _fac2OR() {}